

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisitorTests.cpp
# Opt level: O3

FunctionPortSyntax * __thiscall
RewriterBase<InterleavedRewriter>::makeArg(RewriterBase<InterleavedRewriter> *this,string_view name)

{
  SyntaxFactory *this_00;
  Token staticKeyword;
  Token varKeyword;
  Token name_00;
  DeclaratorSyntax *declarator;
  FunctionPortSyntax *pFVar1;
  Token local_e0;
  Token local_d0;
  Token local_c0;
  Token local_b0;
  SyntaxList<slang::syntax::VariableDimensionSyntax> local_a0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  this_00 = &(this->super_SyntaxRewriter<InterleavedRewriter>).factory;
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.childCount = 0;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)0x0;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = 0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
  slang::parsing::Token::Token(&local_c0);
  slang::parsing::Token::Token(&local_b0);
  slang::parsing::Token::Token(&local_d0);
  slang::parsing::Token::Token(&local_e0);
  slang::parsing::Token::Token
            ((Token *)&local_a0,(BumpAllocator *)this,Identifier,
             (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),name,
             (SourceLocation)0xffffffffffffffff);
  name_00.info._0_4_ = local_a0.super_SyntaxListBase.super_SyntaxNode.kind;
  name_00._0_8_ = local_a0.super_SyntaxListBase._vptr_SyntaxListBase;
  name_00.info._4_4_ = local_a0.super_SyntaxListBase.super_SyntaxNode._4_4_;
  local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_a0.super_SyntaxListBase.childCount = 0;
  local_a0.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)0x0;
  local_a0.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = 0;
  local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c980;
  declarator = slang::syntax::SyntaxFactory::declarator
                         (this_00,name_00,&local_a0,(EqualsValueClauseSyntax *)0x0);
  staticKeyword.info = local_d0.info;
  staticKeyword.kind = local_d0.kind;
  staticKeyword._2_1_ = local_d0._2_1_;
  staticKeyword.numFlags.raw = local_d0.numFlags.raw;
  staticKeyword.rawLen = local_d0.rawLen;
  varKeyword.info = local_e0.info;
  varKeyword.kind = local_e0.kind;
  varKeyword._2_1_ = local_e0._2_1_;
  varKeyword.numFlags.raw = local_e0.numFlags.raw;
  varKeyword.rawLen = local_e0.rawLen;
  pFVar1 = slang::syntax::SyntaxFactory::functionPort
                     (this_00,&local_68,local_c0,local_b0,staticKeyword,varKeyword,
                      (DataTypeSyntax *)0x0,declarator);
  return pFVar1;
}

Assistant:

FunctionPortSyntax& makeArg(std::string_view name) {
        return this->factory.functionPort(nullptr, {}, {}, {}, {}, nullptr,
                                          this->factory.declarator(this->makeId(name), nullptr,
                                                                   nullptr));
    }